

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool.cxx
# Opt level: O0

bool __thiscall
cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo
          (cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this,string *file,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *libs,vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *rpaths)

{
  cmRuntimeDependencyArchive *this_00;
  pointer this_01;
  bool bVar1;
  byte bVar2;
  int iVar3;
  cmUVProcessChainBuilder *this_02;
  Status *pSVar4;
  ostream *poVar5;
  uv_loop_t *loop;
  istream *piVar6;
  char *pcVar7;
  string local_e90;
  undefined1 local_e70 [8];
  ostringstream e_2;
  string local_cf8;
  undefined1 local_cd8 [8];
  ostringstream e_1;
  allocator<char> local_b59;
  string local_b58;
  string local_b38;
  undefined1 local_b18 [8];
  RegularExpressionMatch nameMatch;
  string local_908;
  allocator<char> local_8e1;
  string local_8e0;
  string local_8c0;
  undefined1 local_8a0 [8];
  RegularExpressionMatch pathMatch;
  string local_690;
  undefined1 local_670 [8];
  RegularExpressionMatch cmdMatch;
  cmUVPipeIStream output;
  string line;
  undefined1 local_288 [8];
  ostringstream e;
  undefined1 local_110 [8];
  cmUVProcessChain process;
  cmUVProcessChainBuilder builder;
  string local_a0;
  allocator<char> local_69;
  string local_68;
  undefined1 local_48 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  command;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *rpaths_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *libs_local;
  string *file_local;
  cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool *this_local;
  
  command.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)rpaths;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_48);
  this_00 = (this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool).Archive;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,"otool",&local_69);
  bVar1 = cmRuntimeDependencyArchive::GetGetRuntimeDependenciesCommand
                    (this_00,&local_68,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  if (((bVar1 ^ 0xffU) & 1) == 0) {
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<char_const(&)[3]>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,
               (char (*) [3])0x107a25c);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string_const&>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_48,file);
    cmUVProcessChainBuilder::cmUVProcessChainBuilder((cmUVProcessChainBuilder *)&process);
    this_02 = cmUVProcessChainBuilder::SetBuiltinStream
                        ((cmUVProcessChainBuilder *)&process,Stream_OUTPUT);
    cmUVProcessChainBuilder::AddCommand
              (this_02,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_48);
    cmUVProcessChainBuilder::Start((cmUVProcessChainBuilder *)local_110);
    bVar1 = cmUVProcessChain::Valid((cmUVProcessChain *)local_110);
    if ((bVar1) &&
       (pSVar4 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_110,0),
       pSVar4->SpawnResult == 0)) {
      std::__cxx11::string::string((string *)&output.field_0x198);
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::rpathRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::rpathRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression(&GetFileInfo::rpathRegex,"^ *cmd LC_RPATH$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::rpathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::rpathRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::loadDylibRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::loadDylibRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::loadDylibRegex,"^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::loadDylibRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::loadDylibRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::pathRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::pathRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::pathRegex,"^ *path (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::pathRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::pathRegex);
      }
      if ((GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
           ::nameRegex == '\0') &&
         (iVar3 = __cxa_guard_acquire(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                                       ::nameRegex), iVar3 != 0)) {
        cmsys::RegularExpression::RegularExpression
                  (&GetFileInfo::nameRegex,"^ *name (.*) \\(offset [0-9]+\\)$");
        __cxa_atexit(cmsys::RegularExpression::~RegularExpression,&GetFileInfo::nameRegex,
                     &__dso_handle);
        __cxa_guard_release(&GetFileInfo(std::__cxx11::string_const&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>&)
                             ::nameRegex);
      }
      loop = cmUVProcessChain::GetLoop((cmUVProcessChain *)local_110);
      iVar3 = cmUVProcessChain::OutputStream((cmUVProcessChain *)local_110);
      cmBasicUVPipeIStream<char,_std::char_traits<char>_>::cmBasicUVPipeIStream
                ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)&cmdMatch.searchstring,loop,
                 iVar3);
LAB_00a5fe36:
      piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                         ((istream *)&cmdMatch.searchstring,(string *)&output.field_0x198);
      bVar1 = std::ios::operator_cast_to_bool
                        ((ios *)((long)&piVar6->_vptr_basic_istream +
                                (long)piVar6->_vptr_basic_istream[-3]));
      if (bVar1) {
        cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_670);
        pcVar7 = (char *)std::__cxx11::string::c_str();
        bVar1 = cmsys::RegularExpression::find
                          (&GetFileInfo::rpathRegex,pcVar7,(RegularExpressionMatch *)local_670);
        if (bVar1) {
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&cmdMatch.searchstring,(string *)&output.field_0x198);
          bVar2 = std::ios::operator!((ios *)((long)&piVar6->_vptr_basic_istream +
                                             (long)piVar6->_vptr_basic_istream[-3]));
          if ((bVar2 & 1) != 0) {
LAB_00a5ff55:
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_690,"Invalid output from otool",
                       (allocator<char> *)((long)&pathMatch.searchstring + 7));
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                      (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_690);
            std::__cxx11::string::~string((string *)&local_690);
            std::allocator<char>::~allocator((allocator<char> *)((long)&pathMatch.searchstring + 7))
            ;
            this_local._7_1_ = false;
            builder.Loop._0_4_ = 1;
            goto LAB_00a6069c;
          }
          piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                             ((istream *)&cmdMatch.searchstring,(string *)&output.field_0x198);
          bVar2 = std::ios::operator!((ios *)((long)&piVar6->_vptr_basic_istream +
                                             (long)piVar6->_vptr_basic_istream[-3]));
          if ((bVar2 & 1) != 0) goto LAB_00a5ff55;
          cmsys::RegularExpressionMatch::RegularExpressionMatch((RegularExpressionMatch *)local_8a0)
          ;
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::RegularExpression::find
                            (&GetFileInfo::pathRegex,pcVar7,(RegularExpressionMatch *)local_8a0);
          this_01 = command.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage;
          if (!bVar1) {
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_8e0,"Invalid output from otool",&local_8e1);
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                      (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_8e0);
            std::__cxx11::string::~string((string *)&local_8e0);
            std::allocator<char>::~allocator(&local_8e1);
            this_local._7_1_ = false;
            builder.Loop._0_4_ = 1;
            goto LAB_00a6069c;
          }
          cmsys::RegularExpressionMatch::match_abi_cxx11_
                    (&local_8c0,(RegularExpressionMatch *)local_8a0,1);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)this_01,&local_8c0);
          std::__cxx11::string::~string((string *)&local_8c0);
        }
        else {
          pcVar7 = (char *)std::__cxx11::string::c_str();
          bVar1 = cmsys::RegularExpression::find
                            (&GetFileInfo::loadDylibRegex,pcVar7,(RegularExpressionMatch *)local_670
                            );
          if (bVar1) {
            piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                               ((istream *)&cmdMatch.searchstring,(string *)&output.field_0x198);
            bVar2 = std::ios::operator!((ios *)((long)&piVar6->_vptr_basic_istream +
                                               (long)piVar6->_vptr_basic_istream[-3]));
            if ((bVar2 & 1) == 0) {
              piVar6 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                                 ((istream *)&cmdMatch.searchstring,(string *)&output.field_0x198);
              bVar2 = std::ios::operator!((ios *)((long)&piVar6->_vptr_basic_istream +
                                                 (long)piVar6->_vptr_basic_istream[-3]));
              if ((bVar2 & 1) == 0) {
                cmsys::RegularExpressionMatch::RegularExpressionMatch
                          ((RegularExpressionMatch *)local_b18);
                pcVar7 = (char *)std::__cxx11::string::c_str();
                bVar1 = cmsys::RegularExpression::find
                                  (&GetFileInfo::nameRegex,pcVar7,
                                   (RegularExpressionMatch *)local_b18);
                if (!bVar1) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_b58,"Invalid output from otool",&local_b59);
                  cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                            (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_b58)
                  ;
                  std::__cxx11::string::~string((string *)&local_b58);
                  std::allocator<char>::~allocator(&local_b59);
                  this_local._7_1_ = false;
                  builder.Loop._0_4_ = 1;
                  goto LAB_00a6069c;
                }
                cmsys::RegularExpressionMatch::match_abi_cxx11_
                          (&local_b38,(RegularExpressionMatch *)local_b18,1);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::push_back(libs,&local_b38);
                std::__cxx11::string::~string((string *)&local_b38);
                goto LAB_00a5fe36;
              }
            }
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_908,"Invalid output from otool",
                       (allocator<char> *)((long)&nameMatch.searchstring + 7));
            cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                      (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_908);
            std::__cxx11::string::~string((string *)&local_908);
            std::allocator<char>::~allocator((allocator<char> *)((long)&nameMatch.searchstring + 7))
            ;
            this_local._7_1_ = false;
            builder.Loop._0_4_ = 1;
            goto LAB_00a6069c;
          }
        }
        goto LAB_00a5fe36;
      }
      bVar1 = cmUVProcessChain::Wait((cmUVProcessChain *)local_110,0);
      if (bVar1) {
        pSVar4 = cmUVProcessChain::GetStatus((cmUVProcessChain *)local_110,0);
        if (pSVar4->ExitStatus == 0) {
          this_local._7_1_ = true;
          builder.Loop._0_4_ = 1;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_e70);
          poVar5 = std::operator<<((ostream *)local_e70,"Failed to run otool on:\n  ");
          std::operator<<(poVar5,(string *)file);
          std::__cxx11::ostringstream::str();
          cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                    (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_e90);
          std::__cxx11::string::~string((string *)&local_e90);
          this_local._7_1_ = false;
          builder.Loop._0_4_ = 1;
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_e70);
        }
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_cd8);
        poVar5 = std::operator<<((ostream *)local_cd8,"Failed to wait on otool process for:\n  ");
        std::operator<<(poVar5,(string *)file);
        std::__cxx11::ostringstream::str();
        cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                  (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_cf8);
        std::__cxx11::string::~string((string *)&local_cf8);
        this_local._7_1_ = false;
        builder.Loop._0_4_ = 1;
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_cd8);
      }
LAB_00a6069c:
      cmBasicUVPipeIStream<char,_std::char_traits<char>_>::~cmBasicUVPipeIStream
                ((cmBasicUVPipeIStream<char,_std::char_traits<char>_> *)&cmdMatch.searchstring);
      std::__cxx11::string::~string((string *)&output.field_0x198);
    }
    else {
      std::__cxx11::ostringstream::ostringstream((ostringstream *)local_288);
      poVar5 = std::operator<<((ostream *)local_288,"Failed to start otool process for:\n  ");
      std::operator<<(poVar5,(string *)file);
      std::__cxx11::ostringstream::str();
      cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
                (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,
                 (string *)((long)&line.field_2 + 8));
      std::__cxx11::string::~string((string *)(line.field_2._M_local_buf + 8));
      this_local._7_1_ = false;
      builder.Loop._0_4_ = 1;
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_288);
    }
    cmUVProcessChain::~cmUVProcessChain((cmUVProcessChain *)local_110);
    cmUVProcessChainBuilder::~cmUVProcessChainBuilder((cmUVProcessChainBuilder *)&process);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_a0,"Could not find otool",
               (allocator<char> *)((long)&builder.Loop + 7));
    cmBinUtilsMacOSMachOGetRuntimeDependenciesTool::SetError
              (&this->super_cmBinUtilsMacOSMachOGetRuntimeDependenciesTool,&local_a0);
    std::__cxx11::string::~string((string *)&local_a0);
    std::allocator<char>::~allocator((allocator<char> *)((long)&builder.Loop + 7));
    this_local._7_1_ = false;
    builder.Loop._0_4_ = 1;
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_48);
  return this_local._7_1_;
}

Assistant:

bool cmBinUtilsMacOSMachOOToolGetRuntimeDependenciesTool::GetFileInfo(
  std::string const& file, std::vector<std::string>& libs,
  std::vector<std::string>& rpaths)
{
  std::vector<std::string> command;
  if (!this->Archive->GetGetRuntimeDependenciesCommand("otool", command)) {
    this->SetError("Could not find otool");
    return false;
  }
  command.emplace_back("-l");
  command.emplace_back(file);

  cmUVProcessChainBuilder builder;
  builder.SetBuiltinStream(cmUVProcessChainBuilder::Stream_OUTPUT)
    .AddCommand(command);

  auto process = builder.Start();
  if (!process.Valid() || process.GetStatus(0).SpawnResult != 0) {
    std::ostringstream e;
    e << "Failed to start otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  std::string line;
  static const cmsys::RegularExpression rpathRegex("^ *cmd LC_RPATH$");
  static const cmsys::RegularExpression loadDylibRegex(
    "^ *cmd LC_LOAD(_WEAK)?_DYLIB$");
  static const cmsys::RegularExpression pathRegex(
    "^ *path (.*) \\(offset [0-9]+\\)$");
  static const cmsys::RegularExpression nameRegex(
    "^ *name (.*) \\(offset [0-9]+\\)$");
  cmUVPipeIStream output(process.GetLoop(), process.OutputStream());
  while (std::getline(output, line)) {
    cmsys::RegularExpressionMatch cmdMatch;
    if (rpathRegex.find(line.c_str(), cmdMatch)) {
      // NOLINTNEXTLINE(misc-redundant-expression)
      if (!std::getline(output, line) || !std::getline(output, line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch pathMatch;
      if (pathRegex.find(line.c_str(), pathMatch)) {
        rpaths.push_back(pathMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    } else if (loadDylibRegex.find(line.c_str(), cmdMatch)) {
      // NOLINTNEXTLINE(misc-redundant-expression)
      if (!std::getline(output, line) || !std::getline(output, line)) {
        this->SetError("Invalid output from otool");
        return false;
      }

      cmsys::RegularExpressionMatch nameMatch;
      if (nameRegex.find(line.c_str(), nameMatch)) {
        libs.push_back(nameMatch.match(1));
      } else {
        this->SetError("Invalid output from otool");
        return false;
      }
    }
  }

  if (!process.Wait()) {
    std::ostringstream e;
    e << "Failed to wait on otool process for:\n  " << file;
    this->SetError(e.str());
    return false;
  }
  if (process.GetStatus(0).ExitStatus != 0) {
    std::ostringstream e;
    e << "Failed to run otool on:\n  " << file;
    this->SetError(e.str());
    return false;
  }

  return true;
}